

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O3

int GetUBXPacketublox(UBLOX *publox,UBXDATA *pUBXData)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ssize_t sVar7;
  long lVar8;
  ulong uVar9;
  uchar uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uchar uVar14;
  uchar *puVar15;
  CHRONO chrono;
  uchar recvbuf [4096];
  timespec local_1090;
  timespec local_1080;
  undefined8 local_1070;
  undefined8 uStack_1068;
  long local_1060;
  long lStack_1058;
  timespec local_1050;
  int local_1040;
  uchar local_1038 [4104];
  
  iVar5 = clock_getres(4,&local_1050);
  if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_1080), iVar5 == 0)) {
    local_1040 = 0;
    local_1070 = 0;
    uStack_1068 = 0;
    local_1060 = 0;
    lStack_1058 = 0;
  }
  uVar9 = 0;
  memset(local_1038,0,0x1000);
  iVar5 = (publox->RS232Port).DevType;
  if (iVar5 - 1U < 4) {
    iVar5 = (publox->RS232Port).s;
    do {
      sVar7 = recv(iVar5,local_1038 + uVar9,(ulong)(8 - (int)uVar9),0);
      if ((int)sVar7 < 1) goto LAB_00118167;
      uVar11 = (int)uVar9 + (int)sVar7;
      uVar9 = (ulong)uVar11;
    } while ((int)uVar11 < 8);
  }
  else {
    if (iVar5 != 0) {
LAB_00118167:
      puts("Error reading data from a ublox. ");
      return 1;
    }
    iVar5 = *(int *)&(publox->RS232Port).hDev;
    uVar9 = 0;
    do {
      sVar7 = read(iVar5,local_1038 + uVar9,(ulong)(8 - (int)uVar9));
      if ((int)sVar7 < 1) goto LAB_00118167;
      uVar11 = (int)uVar9 + (int)sVar7;
      uVar9 = (ulong)uVar11;
    } while (uVar11 < 8);
  }
  if ((publox->bSaveRawData != 0) && ((FILE *)publox->pfSaveFile != (FILE *)0x0)) {
    fwrite(local_1038,8,1,(FILE *)publox->pfSaveFile);
    fflush((FILE *)publox->pfSaveFile);
  }
  iVar5 = 8;
  do {
    uVar11 = 0;
    puVar15 = local_1038;
    do {
      uVar6 = iVar5 - uVar11;
      if ((int)uVar6 < 8) {
        uVar12 = 8;
LAB_00117f93:
        uVar12 = uVar12 - uVar6;
        goto LAB_00117f95;
      }
      lVar8 = 1;
      if ((*puVar15 == 0xb5) && (puVar15[1] == 'b')) {
        uVar3 = *(ushort *)(puVar15 + 4);
        uVar9 = (ulong)uVar3;
        uVar12 = uVar3 + 8;
        if (uVar6 < uVar12) goto LAB_00117f93;
        bVar1 = puVar15[2];
        bVar2 = puVar15[3];
        lVar8 = 0;
        uVar10 = '\0';
        uVar14 = '\0';
        do {
          uVar14 = uVar14 + puVar15[lVar8 + 2];
          uVar10 = uVar10 + uVar14;
          lVar8 = lVar8 + 1;
        } while (uVar9 + 4 != lVar8);
        if ((puVar15[uVar9 + 6] == uVar14) && (puVar15[uVar9 + 7] == uVar10)) {
          if (0 < (int)((iVar5 - (uVar11 + uVar3)) + -8)) {
            puts("Warning getting data from a ublox : Unexpected data after a packet. ");
          }
          iVar5 = ProcessPacketUBX(puVar15,uVar12,(uint)bVar1,(uint)bVar2,pUBXData);
          return (uint)(iVar5 != 0);
        }
        puts("Warning : UBX checksum error. ");
        lVar8 = 2;
      }
      puVar15 = puVar15 + lVar8;
      uVar11 = uVar11 + (int)lVar8;
      uVar6 = iVar5 - uVar11;
    } while (uVar6 != 0 && (int)uVar11 <= iVar5);
    uVar12 = 8;
    if ((int)uVar11 < 8) {
      uVar12 = uVar11;
    }
LAB_00117f95:
    memmove(local_1038,local_1038 + (int)uVar11,(long)(int)uVar6);
    iVar5 = uVar6 + uVar12;
    if (0xfff < iVar5) {
      puts("Error reading data from a ublox : Invalid data. ");
      return 4;
    }
    puVar15 = local_1038 + (int)uVar6;
    iVar4 = (publox->RS232Port).DevType;
    if (iVar4 - 1U < 4) {
      if (0 < (int)uVar12) {
        iVar4 = (publox->RS232Port).s;
        uVar11 = 0;
        do {
          sVar7 = recv(iVar4,puVar15 + uVar11,(long)(int)(uVar12 - uVar11),0);
          if ((int)sVar7 < 1) goto LAB_00118167;
          uVar11 = uVar11 + (int)sVar7;
        } while ((int)uVar11 < (int)uVar12);
      }
    }
    else {
      if (iVar4 != 0) goto LAB_00118167;
      if (uVar12 != 0) {
        iVar4 = *(int *)&(publox->RS232Port).hDev;
        uVar11 = 0;
        do {
          sVar7 = read(iVar4,puVar15 + uVar11,(ulong)(uVar12 - uVar11));
          if ((int)sVar7 < 1) goto LAB_00118167;
          uVar11 = uVar11 + (int)sVar7;
        } while (uVar11 < uVar12);
      }
    }
    if ((publox->bSaveRawData != 0) && ((FILE *)publox->pfSaveFile != (FILE *)0x0)) {
      fwrite(puVar15,(long)(int)uVar12,1,(FILE *)publox->pfSaveFile);
      fflush((FILE *)publox->pfSaveFile);
    }
    lVar13 = local_1060;
    lVar8 = lStack_1058;
    if (local_1040 == 0) {
      clock_gettime(4,&local_1090);
      lVar13 = ((local_1090.tv_sec + local_1060) - local_1080.tv_sec) +
               (local_1090.tv_nsec + lStack_1058) / 1000000000;
      lVar8 = (local_1090.tv_nsec + lStack_1058) % 1000000000 - local_1080.tv_nsec;
      if (lVar8 < 0) {
        lVar13 = lVar13 + ~((ulong)-lVar8 / 1000000000);
        lVar8 = lVar8 + 1000000000 + ((ulong)-lVar8 / 1000000000) * 1000000000;
      }
    }
    if (4.0 < (double)lVar8 / 1000000000.0 + (double)lVar13) {
      puts("Error reading data from a ublox : Packet timeout. ");
      return 2;
    }
  } while( true );
}

Assistant:

inline int GetUBXPacketublox(UBLOX* publox, UBXDATA* pUBXData)
{
	unsigned char recvbuf[MAX_NB_BYTES_UBLOX];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	unsigned char* ptr = NULL;
	int packetlen = 0;
	int mclass = 0, mid = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_UBLOX-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired message...

	nbBytesToRequest = MIN_PACKET_LENGTH_UBX;
	if (ReadAllRS232Port(&publox->RS232Port, recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(recvbuf, nbBytesToRequest, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}
	BytesReceived += nbBytesToRequest;
	
	for (;;)
	{
		res = FindPacketUBX(recvbuf, BytesReceived, &mclass, &mid, &packetlen, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(MIN_PACKET_LENGTH_UBX, nbBytesDiscarded);
		}	
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a ublox : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&publox->RS232Port, recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a ublox. \n");
			return EXIT_FAILURE;
		}
		if ((publox->bSaveRawData)&&(publox->pfSaveFile))
		{
			fwrite(recvbuf+BytesReceived, nbBytesToRequest, 1, publox->pfSaveFile);
			fflush(publox->pfSaveFile);
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_UBLOX)
		{
			printf("Error reading data from a ublox : Packet timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-packetlen > 0)
	{
		printf("Warning getting data from a ublox : Unexpected data after a packet. \n");
	}

	//// Get data bytes.

	//memset(databuf, 0, databuflen);

	//// Check the number of data bytes before copy.
	//if (databuflen < *ppacketlen)
	//{
	//	printf("Error getting data from a ublox : Too small data buffer. \n");
	//	return EXIT_FAILURE;
	//}

	//// Copy the data bytes of the message.
	//if (*ppacketlen > 0)
	//{
	//	memcpy(databuf, ptr, *ppacketlen);
	//}

	if (ProcessPacketUBX(ptr, packetlen, mclass, mid, pUBXData) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}